

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigUInt.cpp
# Opt level: O1

int __thiscall Js::BigUInt::Compare(BigUInt *this,BigUInt *pbi)

{
  int iVar1;
  code *pcVar2;
  int iVar3;
  bool bVar4;
  undefined4 *puVar5;
  int iVar6;
  
  iVar6 = 1;
  AssertValid(this,true);
  if (pbi == (BigUInt *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x13e,"(pbi)","pbi");
    if (!bVar4) {
LAB_00697b32:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  AssertValid(pbi,true);
  iVar1 = this->m_clu;
  if (((iVar1 <= pbi->m_clu) && (iVar6 = -1, pbi->m_clu <= iVar1)) && (iVar6 = 0, iVar1 != 0)) {
    iVar3 = iVar1;
    do {
      iVar3 = iVar3 + -1;
      if (this->m_prglu[iVar3] != pbi->m_prglu[iVar3]) {
        if (iVar3 < 0 || iVar1 <= iVar3) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                      ,0x14f,"(ilu >= 0 && ilu < m_clu)","ilu >= 0 && ilu < m_clu");
          if (!bVar4) goto LAB_00697b32;
          *puVar5 = 0;
        }
        if (this->m_prglu[iVar3] == pbi->m_prglu[iVar3]) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                      ,0x150,"(m_prglu[ilu] != pbi->m_prglu[ilu])",
                                      "m_prglu[ilu] != pbi->m_prglu[ilu]");
          if (!bVar4) goto LAB_00697b32;
          *puVar5 = 0;
        }
        return (pbi->m_prglu[iVar3] < this->m_prglu[iVar3]) - 1 | 1;
      }
    } while (iVar3 != 0);
  }
  return iVar6;
}

Assistant:

int BigUInt::Compare(BigUInt *pbi)
    {
        AssertBi(this);
        AssertBi(pbi);

        int32 ilu;

        if (m_clu > pbi->m_clu)
            return 1;
        if (m_clu < pbi->m_clu)
            return -1;
        if (0 == m_clu)
            return 0;

#pragma prefast(suppress:__WARNING_LOOP_ONLY_EXECUTED_ONCE,"noise")
        for (ilu = m_clu - 1; m_prglu[ilu] == pbi->m_prglu[ilu]; ilu--)
        {
            if (0 == ilu)
                return 0;
        }
        Assert(ilu >= 0 && ilu < m_clu);
        Assert(m_prglu[ilu] != pbi->m_prglu[ilu]);

        return (m_prglu[ilu] > pbi->m_prglu[ilu]) ? 1 : -1;
    }